

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O1

void * OPENSSL_realloc(void *orig_ptr,size_t new_size)

{
  ulong uVar1;
  void *pvVar2;
  
  if (orig_ptr == (void *)0x0) {
    pvVar2 = OPENSSL_malloc(new_size);
    return pvVar2;
  }
  uVar1 = OPENSSL_memory_get_size(orig_ptr);
  pvVar2 = OPENSSL_malloc(new_size);
  if (pvVar2 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    if (uVar1 < new_size) {
      new_size = uVar1;
    }
    memcpy(pvVar2,orig_ptr,new_size);
    OPENSSL_free(orig_ptr);
  }
  return pvVar2;
}

Assistant:

void *OPENSSL_realloc(void *orig_ptr, size_t new_size) {
  if (orig_ptr == NULL) {
    return OPENSSL_malloc(new_size);
  }

  size_t old_size;
  if (OPENSSL_memory_get_size != NULL) {
    old_size = OPENSSL_memory_get_size(orig_ptr);
  } else {
    void *ptr = ((uint8_t *)orig_ptr) - OPENSSL_MALLOC_PREFIX;
    __asan_unpoison_memory_region(ptr, OPENSSL_MALLOC_PREFIX);
    old_size = *(size_t *)ptr;
    __asan_poison_memory_region(ptr, OPENSSL_MALLOC_PREFIX);
  }

  void *ret = OPENSSL_malloc(new_size);
  if (ret == NULL) {
    return NULL;
  }

  size_t to_copy = new_size;
  if (old_size < to_copy) {
    to_copy = old_size;
  }

  memcpy(ret, orig_ptr, to_copy);
  OPENSSL_free(orig_ptr);

  return ret;
}